

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void __thiscall
duckdb::RangeFunctionBindData::RangeFunctionBindData
          (RangeFunctionBindData *this,vector<duckdb::Value,_true> *inputs)

{
  const_reference pvVar1;
  int64_t iVar2;
  size_type __n;
  hugeint_t input;
  hugeint_t hVar3;
  unsigned_long result;
  hugeint_t increment;
  hugeint_t end;
  hugeint_t start;
  int64_t values [3];
  uint64_t local_80;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_58;
  int64_t local_48 [4];
  hugeint_t local_28;
  
  (this->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->cardinality = 0;
  (this->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__TableFunctionData_02489678;
  if ((inputs->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (inputs->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::Value,_true>::operator[](inputs,__n);
      if (pvVar1->is_null != false) {
        return;
      }
      pvVar1 = vector<duckdb::Value,_true>::operator[](inputs,__n);
      iVar2 = Value::GetValue<long>(pvVar1);
      local_48[__n] = iVar2;
      __n = __n + 1;
    } while (__n < (ulong)((long)(inputs->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(inputs->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  GetParameters(local_48,(long)(inputs->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                               .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(inputs->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                               .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 6,&local_58,&local_68,
                &local_78);
  local_28 = hugeint_t::operator-(&local_68,&local_58);
  hVar3 = hugeint_t::operator/(&local_28,&local_78);
  local_80 = 0;
  input.upper = (int64_t)&local_80;
  input.lower = hVar3.upper;
  Hugeint::TryCast<unsigned_long>((Hugeint *)hVar3.lower,input,&local_80);
  this->cardinality = local_80;
  return;
}

Assistant:

explicit RangeFunctionBindData(const vector<Value> &inputs) : cardinality(0) {
		int64_t values[3];
		for (idx_t i = 0; i < inputs.size(); i++) {
			if (inputs[i].IsNull()) {
				return;
			}
			values[i] = inputs[i].GetValue<int64_t>();
		}
		hugeint_t start;
		hugeint_t end;
		hugeint_t increment;
		GetParameters(values, inputs.size(), start, end, increment);
		cardinality = Hugeint::Cast<idx_t>((end - start) / increment);
	}